

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbistbl.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::RBBISymbolTable::parseReference
          (UnicodeString *__return_storage_ptr__,RBBISymbolTable *this,UnicodeString *text,
          ParsePosition *pos,int32_t limit)

{
  UBool UVar1;
  char16_t cVar2;
  uint uVar3;
  uint local_34;
  UChar c;
  int32_t i;
  int32_t start;
  int32_t limit_local;
  ParsePosition *pos_local;
  UnicodeString *text_local;
  RBBISymbolTable *this_local;
  UnicodeString *result;
  
  uVar3 = ParsePosition::getIndex(pos);
  UnicodeString::UnicodeString(__return_storage_ptr__);
  local_34 = uVar3;
  while (((int)local_34 < limit &&
         (((cVar2 = UnicodeString::charAt(text,local_34), local_34 != uVar3 ||
           (UVar1 = u_isIDStart_63((uint)(ushort)cVar2), UVar1 != '\0')) &&
          (UVar1 = u_isIDPart_63((uint)(ushort)cVar2), UVar1 != '\0'))))) {
    local_34 = local_34 + 1;
  }
  if (local_34 != uVar3) {
    ParsePosition::setIndex(pos,local_34);
    (*(text->super_Replaceable).super_UObject._vptr_UObject[3])
              (text,(ulong)uVar3,(ulong)local_34,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString   RBBISymbolTable::parseReference(const UnicodeString& text,
                                                ParsePosition& pos, int32_t limit) const
{
    int32_t start = pos.getIndex();
    int32_t i = start;
    UnicodeString result;
    while (i < limit) {
        UChar c = text.charAt(i);
        if ((i==start && !u_isIDStart(c)) || !u_isIDPart(c)) {
            break;
        }
        ++i;
    }
    if (i == start) { // No valid name chars
        return result; // Indicate failure with empty string
    }
    pos.setIndex(i);
    text.extractBetween(start, i, result);
    return result;
}